

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_263068::ECCurveTest_AddingEqualPoints_Test::TestBody
          (ECCurveTest_AddingEqualPoints_Test *this)

{
  bool bVar1;
  ParamType_conflict *pPVar2;
  pointer peVar3;
  char *pcVar4;
  EC_GROUP *pEVar5;
  pointer peVar6;
  EC_POINT *pEVar7;
  pointer pbVar8;
  pointer peVar9;
  pointer b;
  Message *message;
  char *in_R9;
  AssertHelper local_368;
  Message local_360;
  int local_358 [2];
  undefined1 local_350 [8];
  AssertionResult gtest_ar;
  AssertHelper local_320;
  Message local_318;
  int local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__9;
  UniquePtr<EC_POINT> p1_plus_p2;
  AssertHelper local_290;
  Message local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_248;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__7;
  UniquePtr<BN_CTX> ctx;
  AssertHelper local_200;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<EC_POINT> double_p1;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<EC_POINT> p2;
  AssertHelper local_128;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<EC_POINT> p1;
  AssertHelper local_98;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EC_KEY> key;
  ECCurveTest_AddingEqualPoints_Test *this_local;
  
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  peVar3 = (pointer)EC_KEY_new_by_curve_name(*pPVar2);
  std::unique_ptr<ec_key_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&gtest_ar_.message_,peVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ec_key_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8f28b1,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x2a3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    peVar3 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_84 = EC_KEY_generate_key((EC_KEY *)peVar3);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_80,&local_84,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&p1,(internal *)local_80,
                 (AssertionResult *)"EC_KEY_generate_key(key.get())","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0x2a4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&p1);
      testing::Message::~Message(&local_90);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pEVar5 = ECCurveTest::group(&this->super_ECCurveTest);
      peVar6 = (pointer)EC_POINT_new((EC_GROUP *)pEVar5);
      std::unique_ptr<ec_point_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)&gtest_ar__2.message_,peVar6);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<ec_point_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d0,(AssertionResult *)0x854bdd,
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x2a7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        peVar6 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                            &gtest_ar__2.message_);
        peVar3 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        pEVar7 = EC_KEY_get0_public_key((EC_KEY *)peVar3);
        local_114 = EC_POINT_copy((EC_POINT *)peVar6,pEVar7);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_110,&local_114,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&p2,(internal *)local_110,
                     (AssertionResult *)"EC_POINT_copy(p1.get(), EC_KEY_get0_public_key(key.get()))"
                     ,"false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x2a8,pcVar4);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&p2);
          testing::Message::~Message(&local_120);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pEVar5 = ECCurveTest::group(&this->super_ECCurveTest);
          peVar6 = (pointer)EC_POINT_new((EC_GROUP *)pEVar5);
          std::unique_ptr<ec_point_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)&gtest_ar__4.message_,peVar6
                    );
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<ec_point_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_160,
                     (unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_160,
                       (AssertionResult *)0x854c24,"false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x2ab,pcVar4);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_168);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            peVar6 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                &gtest_ar__4.message_);
            peVar3 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            pEVar7 = EC_KEY_get0_public_key((EC_KEY *)peVar3);
            local_1a4 = EC_POINT_copy((EC_POINT *)peVar6,pEVar7);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1a0,&local_1a4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&double_p1,(internal *)local_1a0,
                         (AssertionResult *)
                         "EC_POINT_copy(p2.get(), EC_KEY_get0_public_key(key.get()))","false","true"
                         ,in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x2ac,pcVar4);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&double_p1);
              testing::Message::~Message(&local_1b0);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pEVar5 = ECCurveTest::group(&this->super_ECCurveTest);
              peVar6 = (pointer)EC_POINT_new((EC_GROUP *)pEVar5);
              std::unique_ptr<ec_point_st,bssl::internal::Deleter>::
              unique_ptr<bssl::internal::Deleter,void>
                        ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)&gtest_ar__6.message_,
                         peVar6);
              testing::AssertionResult::
              AssertionResult<std::unique_ptr<ec_point_st,bssl::internal::Deleter>>
                        ((AssertionResult *)local_1f0,
                         (unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_,
                         (type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
              if (!bVar1) {
                testing::Message::Message(&local_1f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ctx,(internal *)local_1f0,(AssertionResult *)"double_p1",
                           "false","true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_200,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x2af,pcVar4);
                testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper(&local_200);
                std::__cxx11::string::~string((string *)&ctx);
                testing::Message::~Message(&local_1f8);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pbVar8 = (pointer)BN_CTX_new();
                std::unique_ptr<bignum_ctx,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<bignum_ctx,bssl::internal::Deleter> *)&gtest_ar__7.message_,
                           pbVar8);
                testing::AssertionResult::
                AssertionResult<std::unique_ptr<bignum_ctx,bssl::internal::Deleter>>
                          ((AssertionResult *)local_238,
                           (unique_ptr<bignum_ctx,_bssl::internal::Deleter> *)&gtest_ar__7.message_,
                           (type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_238);
                if (!bVar1) {
                  testing::Message::Message(&local_240);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_238,
                             (AssertionResult *)0x82c8ac,"false","true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_248,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x2b1,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_248,&local_240);
                  testing::internal::AssertHelper::~AssertHelper(&local_248);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_240);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  pEVar5 = ECCurveTest::group(&this->super_ECCurveTest);
                  peVar6 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__6.message_);
                  peVar9 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__2.message_);
                  pbVar8 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get
                                     ((unique_ptr<bignum_ctx,_bssl::internal::Deleter> *)
                                      &gtest_ar__7.message_);
                  local_27c = EC_POINT_dbl((EC_GROUP *)pEVar5,(EC_POINT *)peVar6,(EC_POINT *)peVar9,
                                           (BN_CTX *)pbVar8);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_278,&local_27c,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_278);
                  if (!bVar1) {
                    testing::Message::Message(&local_288);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&p1_plus_p2,(internal *)local_278,
                               (AssertionResult *)
                               "EC_POINT_dbl(group(), double_p1.get(), p1.get(), ctx.get())","false"
                               ,"true",in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_290,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                               ,0x2b2,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_290,&local_288);
                    testing::internal::AssertHelper::~AssertHelper(&local_290);
                    std::__cxx11::string::~string((string *)&p1_plus_p2);
                    testing::Message::~Message(&local_288);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    pEVar5 = ECCurveTest::group(&this->super_ECCurveTest);
                    peVar6 = (pointer)EC_POINT_new((EC_GROUP *)pEVar5);
                    std::unique_ptr<ec_point_st,bssl::internal::Deleter>::
                    unique_ptr<bssl::internal::Deleter,void>
                              ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)
                               &gtest_ar__9.message_,peVar6);
                    testing::AssertionResult::
                    AssertionResult<std::unique_ptr<ec_point_st,bssl::internal::Deleter>>
                              ((AssertionResult *)local_2c8,
                               (unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                               &gtest_ar__9.message_,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2c8);
                    if (!bVar1) {
                      testing::Message::Message(&local_2d0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__10.message_,(internal *)local_2c8,
                                 (AssertionResult *)"p1_plus_p2","false","true",in_R9);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_2d8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                                 ,0x2b5,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
                      testing::internal::AssertHelper::~AssertHelper(&local_2d8);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(&local_2d0);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      pEVar5 = ECCurveTest::group(&this->super_ECCurveTest);
                      peVar6 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__9.message_);
                      peVar9 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__2.message_);
                      b = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__4.message_);
                      pbVar8 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get
                                         ((unique_ptr<bignum_ctx,_bssl::internal::Deleter> *)
                                          &gtest_ar__7.message_);
                      local_30c = EC_POINT_add((EC_GROUP *)pEVar5,(EC_POINT *)peVar6,
                                               (EC_POINT *)peVar9,(EC_POINT *)b,(BN_CTX *)pbVar8);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_308,&local_30c,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_308);
                      if (!bVar1) {
                        testing::Message::Message(&local_318);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar.message_,(internal *)local_308,
                                   (AssertionResult *)
                                   "EC_POINT_add(group(), p1_plus_p2.get(), p1.get(), p2.get(), ctx.get())"
                                   ,"false","true",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_320,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                                   ,0x2b7,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_320,&local_318);
                        testing::internal::AssertHelper::~AssertHelper(&local_320);
                        std::__cxx11::string::~string((string *)&gtest_ar.message_);
                        testing::Message::~Message(&local_318);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        local_358[1] = 0;
                        pEVar5 = ECCurveTest::group(&this->super_ECCurveTest);
                        peVar6 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__6.message_);
                        peVar9 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__9.message_);
                        pbVar8 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_ctx,_bssl::internal::Deleter> *)
                                            &gtest_ar__7.message_);
                        local_358[0] = EC_POINT_cmp((EC_GROUP *)pEVar5,(EC_POINT *)peVar6,
                                                    (EC_POINT *)peVar9,(BN_CTX *)pbVar8);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_350,"0",
                                   "EC_POINT_cmp(group(), double_p1.get(), p1_plus_p2.get(), ctx.get())"
                                   ,local_358 + 1,local_358);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_350);
                        if (!bVar1) {
                          testing::Message::Message(&local_360);
                          message = testing::Message::operator<<
                                              (&local_360,(char (*) [10])"A+A != 2A");
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_350);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_368,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                                     ,0x2ba,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_368,message);
                          testing::internal::AssertHelper::~AssertHelper(&local_368);
                          testing::Message::~Message(&local_360);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ = 0;
                      }
                    }
                    std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                               &gtest_ar__9.message_);
                  }
                }
                std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bignum_ctx,_bssl::internal::Deleter> *)&gtest_ar__7.message_)
                ;
              }
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
            }
          }
          std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        }
      }
      std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
  }
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_P(ECCurveTest, AddingEqualPoints) {
  bssl::UniquePtr<EC_KEY> key(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  bssl::UniquePtr<EC_POINT> p1(EC_POINT_new(group()));
  ASSERT_TRUE(p1);
  ASSERT_TRUE(EC_POINT_copy(p1.get(), EC_KEY_get0_public_key(key.get())));

  bssl::UniquePtr<EC_POINT> p2(EC_POINT_new(group()));
  ASSERT_TRUE(p2);
  ASSERT_TRUE(EC_POINT_copy(p2.get(), EC_KEY_get0_public_key(key.get())));

  bssl::UniquePtr<EC_POINT> double_p1(EC_POINT_new(group()));
  ASSERT_TRUE(double_p1);
  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  ASSERT_TRUE(ctx);
  ASSERT_TRUE(EC_POINT_dbl(group(), double_p1.get(), p1.get(), ctx.get()));

  bssl::UniquePtr<EC_POINT> p1_plus_p2(EC_POINT_new(group()));
  ASSERT_TRUE(p1_plus_p2);
  ASSERT_TRUE(
      EC_POINT_add(group(), p1_plus_p2.get(), p1.get(), p2.get(), ctx.get()));

  EXPECT_EQ(0,
            EC_POINT_cmp(group(), double_p1.get(), p1_plus_p2.get(), ctx.get()))
      << "A+A != 2A";
}